

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O3

void test_msg_header_uint32(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err nVar3;
  char *pcVar4;
  size_t sVar5;
  long *plVar6;
  char *pcVar7;
  nng_msg *local_40;
  nng_msg *msg;
  uint32_t v;
  
  nVar1 = nng_msg_alloc(&local_40,0);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1a6,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar4,
                         nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_msg_header_append_u32(local_40,2);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                           ,0x1a8,"%s: expected success, got %s (%d)",
                           "nng_msg_header_append_u32(msg, 2)",pcVar4,nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_msg_header_insert_u32(local_40,1);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                             ,0x1a9,"%s: expected success, got %s (%d)",
                             "nng_msg_header_insert_u32(msg, 1)",pcVar4,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_msg_header_append_u32(local_40,3);
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                               ,0x1aa,"%s: expected success, got %s (%d)",
                               "nng_msg_header_append_u32(msg, 3)",pcVar4,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_msg_header_insert_u32(local_40,0);
          pcVar4 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                 ,0x1ab,"%s: expected success, got %s (%d)",
                                 "nng_msg_header_insert_u32(msg, 0)",pcVar4,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_msg_header_trim_u32(local_40,(uint32_t *)((long)&msg + 4));
            pcVar4 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                   ,0x1ac,"%s: expected success, got %s (%d)",
                                   "nng_msg_header_trim_u32(msg, &v)",pcVar4,nVar1);
            if (iVar2 != 0) {
              iVar2 = acutest_check_((uint)(msg._4_4_ == 0),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                     ,0x1ad,"%s","v == 0");
              if (iVar2 != 0) {
                sVar5 = nng_msg_header_len(local_40);
                iVar2 = acutest_check_((uint)(sVar5 == 0xc),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                       ,0x1ae,"%s","nng_msg_header_len(msg) == sizeof(data)");
                if (iVar2 != 0) {
                  plVar6 = (long *)nng_msg_header(local_40);
                  iVar2 = acutest_check_((uint)((int)plVar6[1] == 0x3000000 &&
                                               *plVar6 == 0x200000001000000),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                         ,0x1af,"%s",
                                         "memcmp(nng_msg_header(msg), data, sizeof(data)) == 0");
                  if (iVar2 != 0) {
                    nVar1 = nng_msg_header_trim_u32(local_40,(uint32_t *)((long)&msg + 4));
                    pcVar4 = nng_strerror(nVar1);
                    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                           ,0x1b0,"%s: expected success, got %s (%d)",
                                           "nng_msg_header_trim_u32(msg, &v)",pcVar4,nVar1);
                    if (iVar2 != 0) {
                      iVar2 = acutest_check_((uint)(msg._4_4_ == 1),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                             ,0x1b1,"%s","v == 1");
                      if (iVar2 != 0) {
                        nVar1 = nng_msg_header_chop_u32(local_40,(uint32_t *)((long)&msg + 4));
                        pcVar4 = nng_strerror(nVar1);
                        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                               ,0x1b2,"%s: expected success, got %s (%d)",
                                               "nng_msg_header_chop_u32(msg, &v)",pcVar4,nVar1);
                        if (iVar2 != 0) {
                          iVar2 = acutest_check_((uint)(msg._4_4_ == 3),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                 ,0x1b3,"%s","v == 3");
                          if (iVar2 != 0) {
                            nVar1 = nng_msg_header_trim_u32(local_40,(uint32_t *)((long)&msg + 4));
                            pcVar4 = nng_strerror(nVar1);
                            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                  ,0x1b4,"%s: expected success, got %s (%d)",
                                                  "nng_msg_header_trim_u32(msg, &v)",pcVar4,nVar1);
                            if (iVar2 != 0) {
                              iVar2 = acutest_check_((uint)(msg._4_4_ == 2),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                  ,0x1b5,"%s","v == 2");
                              if (iVar2 != 0) {
                                nVar3 = nng_msg_header_trim_u32
                                                  (local_40,(uint32_t *)((long)&msg + 4));
                                pcVar4 = nng_strerror(NNG_EINVAL);
                                acutest_check_((uint)(nVar3 == NNG_EINVAL),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                               ,0x1b6,"%s fails with %s",
                                               "nng_msg_header_trim_u32(msg, &v)",pcVar4,nVar1);
                                pcVar4 = nng_strerror(NNG_EINVAL);
                                pcVar7 = nng_strerror(nVar3);
                                acutest_message_("%s: expected %s (%d), got %s (%d)",
                                                 "nng_msg_header_trim_u32(msg, &v)",pcVar4,3,pcVar7,
                                                 (ulong)nVar3);
                                nVar1 = nng_msg_header_chop_u32
                                                  (local_40,(uint32_t *)((long)&msg + 4));
                                pcVar4 = nng_strerror(NNG_EINVAL);
                                acutest_check_((uint)(nVar1 == NNG_EINVAL),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                               ,0x1b7,"%s fails with %s",
                                               "nng_msg_header_chop_u32(msg, &v)",pcVar4);
                                pcVar4 = nng_strerror(NNG_EINVAL);
                                pcVar7 = nng_strerror(nVar1);
                                acutest_message_("%s: expected %s (%d), got %s (%d)",
                                                 "nng_msg_header_chop_u32(msg, &v)",pcVar4,3,pcVar7,
                                                 (ulong)nVar1);
                                nng_msg_clear(local_40);
                                nVar1 = nng_msg_append(local_40,(void *)((long)&msg + 4),1);
                                pcVar4 = nng_strerror(nVar1);
                                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                  ,0x1ba,"%s: expected success, got %s (%d)",
                                                  "nng_msg_append(msg, &v, 1)",pcVar4,nVar1);
                                if (iVar2 != 0) {
                                  nVar3 = nng_msg_trim_u32(local_40,(uint32_t *)((long)&msg + 4));
                                  pcVar4 = nng_strerror(NNG_EINVAL);
                                  acutest_check_((uint)(nVar3 == NNG_EINVAL),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                 ,0x1bb,"%s fails with %s",
                                                 "nng_msg_trim_u32(msg, &v)",pcVar4,nVar1);
                                  pcVar4 = nng_strerror(NNG_EINVAL);
                                  pcVar7 = nng_strerror(nVar3);
                                  acutest_message_("%s: expected %s (%d), got %s (%d)",
                                                   "nng_msg_trim_u32(msg, &v)",pcVar4,3,pcVar7,
                                                   (ulong)nVar3);
                                  nVar1 = nng_msg_chop_u32(local_40,(uint32_t *)((long)&msg + 4));
                                  pcVar4 = nng_strerror(NNG_EINVAL);
                                  acutest_check_((uint)(nVar1 == NNG_EINVAL),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                 ,0x1bc,"%s fails with %s",
                                                 "nng_msg_chop_u32(msg, &v)",pcVar4);
                                  pcVar4 = nng_strerror(NNG_EINVAL);
                                  pcVar7 = nng_strerror(nVar1);
                                  acutest_message_("%s: expected %s (%d), got %s (%d)",
                                                   "nng_msg_chop_u32(msg, &v)",pcVar4,3,pcVar7,
                                                   (ulong)nVar1);
                                  nng_msg_free(local_40);
                                  return;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_msg_header_uint32(void)
{
	nng_msg *msg;
	uint32_t v;
	uint8_t  data[] = { 0, 0, 0, 1, 0, 0, 0, 2, 0, 0, 0, 3 };

	NUTS_PASS(nng_msg_alloc(&msg, 0));

	NUTS_PASS(nng_msg_header_append_u32(msg, 2));
	NUTS_PASS(nng_msg_header_insert_u32(msg, 1));
	NUTS_PASS(nng_msg_header_append_u32(msg, 3));
	NUTS_PASS(nng_msg_header_insert_u32(msg, 0));
	NUTS_PASS(nng_msg_header_trim_u32(msg, &v));
	NUTS_ASSERT(v == 0);
	NUTS_ASSERT(nng_msg_header_len(msg) == sizeof(data));
	NUTS_ASSERT(memcmp(nng_msg_header(msg), data, sizeof(data)) == 0);
	NUTS_PASS(nng_msg_header_trim_u32(msg, &v));
	NUTS_ASSERT(v == 1);
	NUTS_PASS(nng_msg_header_chop_u32(msg, &v));
	NUTS_ASSERT(v == 3);
	NUTS_PASS(nng_msg_header_trim_u32(msg, &v));
	NUTS_ASSERT(v == 2);
	NUTS_FAIL(nng_msg_header_trim_u32(msg, &v), NNG_EINVAL);
	NUTS_FAIL(nng_msg_header_chop_u32(msg, &v), NNG_EINVAL);

	nng_msg_clear(msg);
	NUTS_PASS(nng_msg_append(msg, &v, 1));
	NUTS_FAIL(nng_msg_trim_u32(msg, &v), NNG_EINVAL);
	NUTS_FAIL(nng_msg_chop_u32(msg, &v), NNG_EINVAL);

	nng_msg_free(msg);
}